

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseContent(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  unsigned_long uVar6;
  xmlChar *test;
  
  iVar2 = ctxt->nameNr;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->mlType == XML_TYPE_XML) {
    while( true ) {
      pxVar3 = ctxt->input->cur;
      xVar1 = *pxVar3;
      if ((xVar1 == '\0') || (ctxt->instate == XML_PARSER_EOF)) break;
      uVar6 = ctxt->input->consumed;
      if (xVar1 == '<') {
        if (pxVar3[1] == '?') {
          xmlParsePI(ctxt);
        }
        else if (((((pxVar3[1] == '!') && (pxVar3[2] == '[')) && (pxVar3[3] == 'C')) &&
                 ((pxVar3[4] == 'D' && (pxVar3[5] == 'A')))) &&
                ((pxVar3[6] == 'T' && ((pxVar3[7] == 'A' && (pxVar3[8] == '[')))))) {
          xmlParseCDSect(ctxt);
        }
        else {
          if ((pxVar3[1] != '!') || ((pxVar3[2] != '-' || (pxVar3[3] != '-')))) goto LAB_001668fd;
          xmlParseComment(ctxt);
          ctxt->instate = XML_PARSER_CONTENT;
        }
      }
      else {
LAB_001668fd:
        if (xVar1 == '&') {
          xmlParseReference(ctxt);
        }
        else if (xVar1 == '<') {
          if (pxVar3[1] == '/') {
            if (ctxt->nameNr <= iVar2) {
              return;
            }
            xmlParseElementEnd(ctxt);
          }
          else {
            xmlParseElementStart(ctxt);
          }
        }
        else {
          xmlParseCharData(ctxt,0);
        }
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (ctxt->progressive == 0) {
        pxVar4 = ctxt->input;
        if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
           ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
          xmlSHRINK(ctxt);
        }
      }
      if (((ulong)(uint)uVar6 == ctxt->input->consumed) && (pxVar3 == ctxt->input->cur)) {
LAB_001669bb:
        xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"detected an error in element content\n");
        xmlHaltParser(ctxt);
        return;
      }
    }
  }
  else {
    ctxt->quoted = 0;
    pxVar4 = ctxt->input;
    pxVar3 = pxVar4->cur;
    xVar1 = *pxVar3;
    while ((((xVar1 != '\0' && ((ctxt->curly != 0 || ((xVar1 != '\n' && (xVar1 != ';')))))) &&
            (xVar1 != '}')) && (ctxt->instate != XML_PARSER_EOF))) {
      uVar6 = pxVar4->consumed;
      if (xVar1 == '\"') {
        ctxt->quoted = (uint)(ctxt->quoted == 0);
        pxVar4->cur = pxVar3 + 1;
        pxVar4->col = pxVar4->col + 1;
        if (pxVar3[1] == '\0') {
          xmlParserInputGrow(pxVar4,0xfa);
        }
      }
      if (ctxt->quoted != 0) goto LAB_00166a7f;
      xVar1 = *pxVar3;
      if (xVar1 == '?') {
        xmlParsePI(ctxt);
      }
      else if (xVar1 == ';') {
        pxVar4 = ctxt->input;
        pxVar5 = pxVar4->cur;
        pxVar4->cur = pxVar5 + 1;
        pxVar4->col = pxVar4->col + 1;
        if (pxVar5[1] == '\0') {
          xmlParserInputGrow(pxVar4,0xfa);
        }
        xVar1 = *pxVar3;
        if (xVar1 != ' ') {
          if ((xVar1 == '\n') || (xVar1 != '\r' && (byte)(xVar1 - 0xb) < 0xfe)) goto LAB_00166a7f;
        }
LAB_00166ae0:
        xmlParseCharData(ctxt,0);
      }
      else {
        pxVar5 = ctxt->input->cur;
        if (((*pxVar5 == '<') && (pxVar5[1] == '[')) && (pxVar5[2] == '[')) {
          xmlParseCDSect(ctxt);
        }
        else if (xVar1 == ' ') {
LAB_00166a7f:
          if (*pxVar3 != '&') goto LAB_00166ae0;
          xmlParseReference(ctxt);
        }
        else if (xVar1 == '#') {
          xmlParseComment(ctxt);
          ctxt->instate = XML_PARSER_CONTENT;
        }
        else {
          if ((((byte)(xVar1 - 9) < 2) || (xVar1 == '\r')) ||
             ((xVar1 == '\"' || (ctxt->curly != 1)))) goto LAB_00166a7f;
          xmlParseElement(ctxt);
        }
      }
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      if (ctxt->progressive == 0) {
        pxVar4 = ctxt->input;
        if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
           ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
          xmlSHRINK(ctxt);
        }
      }
      if (((ulong)(uint)uVar6 == ctxt->input->consumed) && (pxVar3 == ctxt->input->cur))
      goto LAB_001669bb;
      pxVar4 = ctxt->input;
      pxVar3 = pxVar4->cur;
      xVar1 = *pxVar3;
    }
  }
  return;
}

Assistant:

void
xmlParseContent(xmlParserCtxtPtr ctxt) {
    int nameNr = ctxt->nameNr;

    DEBUG_ENTER(("xmlParseContent(%s);\n", dbgCtxt(ctxt)));
    GROW;
    if (ISXML) {						/* XML*/
	while ((RAW != 0) &&
	       (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *test = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;
	    const xmlChar *cur = ctxt->input->cur;

	    /*
	     * First case : a Processing Instruction.
	     */
	    if ((*cur == '<') && (cur[1] == '?')) {
		xmlParsePI(ctxt);
	    }

	    /*
	     * Second case : a CDSection
	     */
	    /* 2.6.0 test was *cur not RAW */
	    else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
		xmlParseCDSect(ctxt);
	    }

	    /*
	     * Third case :  a comment
	     */
	    else if ((*cur == '<') && (NXT(1) == '!') &&
		     (NXT(2) == '-') && (NXT(3) == '-')) {
		xmlParseComment(ctxt);
		ctxt->instate = XML_PARSER_CONTENT;
	    }

	    /*
	     * Fourth case :  a sub-element.
	     */
	    else if (*cur == '<') {
		if (NXT(1) == '/') {
		    if (ctxt->nameNr <= nameNr)
			break;
		    xmlParseElementEnd(ctxt);
		} else {
		    xmlParseElementStart(ctxt);
		}
	    }

	    /*
	     * Fifth case : a reference. If if has not been resolved,
	     *    parsing returns its Name, create the node
	     */

	    else if (*cur == '&') {
		xmlParseReference(ctxt);
	    }

	    /*
	     * Last case, text. Note that References are handled directly.
	     */
	    else {
		xmlParseCharData(ctxt, 0);
	    }

	    GROW;
	    SHRINK;

	    if ((cons == ctxt->input->consumed) && (test == CUR_PTR)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
			    "detected an error in element content\n");
		xmlHaltParser(ctxt);
		break;
	    }
	}
    } else {							/* SML */
    	ctxt->quoted = 0;
	while ((RAW != 0) &&
	       /* Within a {curly block}, new lines are part of the text
	          Else, they flag the end of the element */
	       /* Likewise, within a {curly block}, ; flags the end of an inner element
	          Else, they flag the end of the current element */
	       ((ctxt->curly) || ((RAW != '\n') && (RAW != ';'))) &&
	       (RAW != '}') &&
	       (ctxt->instate != XML_PARSER_EOF)) {
	    const xmlChar *test = CUR_PTR;
	    unsigned int cons = ctxt->input->consumed;
	    const xmlChar *cur = ctxt->input->cur;
	    XDEBUG_PRINTF(("*cur = '%s';\n", dbgChar(RAW)));
	    int iParsed = 0;

	    if (*cur == '"') {
		ctxt->quoted = !ctxt->quoted;
		SKIP(1);
	    }

	    if (!ctxt->quoted) {
		/*
		 * An element separator
		 */
		if (*cur == ';') {
		    SKIP(1);
		    if (IS_BLANK_CH(*cur) && (*cur != '\n')) {
			xmlParseCharData(ctxt, 0);
			iParsed = 1;
		    }
		}

		/*
		 * First case : a Processing Instruction.
		 */
		else if (*cur == '?') {
		    xmlParsePI(ctxt);
		    iParsed = 1;
		}

		/*
		 * Second case : a CDSection
		 */
		else if (CMP3(CUR_PTR, '<', '[', '[')) {
		    xmlParseCDSect(ctxt);
		    iParsed = 1;
		}

		/*
		 * Third case :  a comment
		 */
		else if (*cur == '#') {
		    xmlParseComment(ctxt);
		    ctxt->instate = XML_PARSER_CONTENT;
		    iParsed = 1;
		}

		/*
		 * Fourth case :  a sub-element.
		 */
		else if ((!IS_BLANK_CH(*cur)) && (*cur != '"') && (ctxt->curly == 1)) {
		    xmlParseElement(ctxt);
		    iParsed = 1;
		}
	    }

	    if (!iParsed) {
		/*
		 * Fifth case : a reference. If if has not been resolved,
		 *    parsing returns its Name, create the node
		 */

		if (*cur == '&') {
		    xmlParseReference(ctxt);
		}

		/*
		 * Last case, text. Note that References are handled directly.
		 */
		else {
		    xmlParseCharData(ctxt, 0);
		}
	    }

	    GROW;
	    SHRINK;

	    if ((cons == ctxt->input->consumed) && (test == CUR_PTR)) {
		xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
			    "detected an error in element content\n");
		xmlHaltParser(ctxt);
		break;
	    }
	}
    }
    RETURN_COMMENT(("xmlParseContent. ctxt = %s;\n", dbgCtxt(ctxt)));
}